

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  void *pvVar1;
  uint8_t **(*__range1) [1024];
  long lVar2;
  uint16_t j;
  long lVar3;
  
  lVar2 = 0;
  do {
    if (*(long *)((long)this->memory + lVar2) != 0) {
      lVar3 = 0;
      do {
        pvVar1 = *(void **)(*(long *)((long)this->memory + lVar2) + lVar3 * 8);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
        }
        *(undefined8 *)(*(long *)((long)this->memory + lVar2) + lVar3 * 8) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x400);
      pvVar1 = *(void **)((long)this->memory + lVar2);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      *(undefined8 *)((long)this->memory + lVar2) = 0;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x2000);
  return;
}

Assistant:

MemoryManager::~MemoryManager(){
    for(auto & i : this->memory){
        if(i){
            for(uint16_t j = 0; j < 1024; j++){
                if(i[j])
                    delete[] i[j];
                i[j] = nullptr;
            }
            delete[] i;
            i = nullptr;
        }
    }
}